

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::take_exactly_iterator<std::_Fwd_list_const_iterator<int>,long>>,boost::iterator_range<std::_Fwd_list_const_iterator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::take_exactly_iterator<std::_Fwd_list_const_iterator<int>,_long>_>
          *lhs,char *op,iterator_range<std::_Fwd_list_const_iterator<int>_> *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = tlssPush();
  filldata<boost::iterator_range<burst::take_exactly_iterator<std::_Fwd_list_const_iterator<int>,_long>_>_>
  ::fill(poVar1,(iterator_range<burst::take_exactly_iterator<std::_Fwd_list_const_iterator<int>,_long>_>
                 *)this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  poVar1 = tlssPush();
  filldata<boost::iterator_range<std::_Fwd_list_const_iterator<int>_>_>::fill
            (poVar1,(iterator_range<std::_Fwd_list_const_iterator<int>_> *)op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }